

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void Col_MListRemove(Col_Word mlist,size_t first,size_t last)

{
  Col_Word CVar1;
  Col_Word right;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  byte *local_50;
  Col_Word tail;
  Col_Word node;
  Col_Word head;
  Col_Word root;
  size_t loop;
  size_t length;
  size_t last_local;
  size_t first_local;
  Col_Word mlist_local;
  
  if (first <= last) {
    head = *(Col_Word *)(mlist + 0x10);
    length = last;
    last_local = first;
    first_local = mlist;
    loop = Col_ListLength(mlist);
    root = Col_ListLoopLength(first_local);
    if ((root == 0) || (loop != root)) {
      if (root == 0) {
        if ((loop != 0) && (last_local < loop)) {
          if (loop <= length) {
            length = loop - 1;
          }
          MListRemove((Col_Word *)(first_local + 0x10),last_local,length);
        }
      }
      else {
        if (head == 0) {
          local_5c = 0;
        }
        else {
          if ((head & 0xf) == 0) {
            if ((*(byte *)head & 2) == 0) {
              local_64 = 0xffffffff;
            }
            else {
              local_64 = *(byte *)head & 0xfffffffe;
            }
            local_60 = local_64;
          }
          else {
            local_60 = immediateWordTypes[head & 0x1f];
          }
          local_5c = local_60;
        }
        if (local_5c != 0x26) {
          ConvertToMConcatNode(&head);
          *(Col_Word *)(first_local + 0x10) = head;
        }
        if ((last_local == 0) && ((loop - root) - 1 <= length)) {
          *(undefined8 *)(first_local + 0x10) = *(undefined8 *)(head + 0x18);
          if (loop - root <= length) {
            Col_MListRemove(first_local,0,length - (loop - root));
          }
        }
        else {
          if (length < loop - root) {
            MListRemove((Col_Word *)(head + 0x10),last_local,length);
          }
          else {
            if (last_local < loop - root) {
              MListRemove((Col_Word *)(head + 0x10),last_local,(loop - root) - 1);
              last_local = 0;
              length = length - (loop - root);
            }
            else {
              last_local = last_local - (loop - root);
              length = length - (loop - root);
            }
            *(undefined8 *)(first_local + 0x10) = *(undefined8 *)(head + 0x18);
            Col_MListRemove(first_local,last_local,length);
            local_50 = *(byte **)(first_local + 0x10);
            if (local_50 == (byte *)0x0) {
              local_68 = 0;
            }
            else {
              if (((ulong)local_50 & 0xf) == 0) {
                if ((*local_50 & 2) == 0) {
                  local_70 = 0xffffffff;
                }
                else {
                  local_70 = *local_50 & 0xfffffffe;
                }
                local_6c = local_70;
              }
              else {
                local_6c = immediateWordTypes[(ulong)local_50 & 0x1f];
              }
              local_68 = local_6c;
            }
            if (local_68 == 0xfffffffa) {
              *(byte **)(head + 0x18) = local_50;
            }
            else {
              if (local_50 == (byte *)0x0) {
                local_74 = 0;
              }
              else {
                if (((ulong)local_50 & 0xf) == 0) {
                  if ((*local_50 & 2) == 0) {
                    local_7c = 0xffffffff;
                  }
                  else {
                    local_7c = *local_50 & 0xfffffffe;
                  }
                  local_78 = local_7c;
                }
                else {
                  local_78 = immediateWordTypes[(ulong)local_50 & 0x1f];
                }
                local_74 = local_78;
              }
              if (local_74 != 0x26) {
                ConvertToMConcatNode((Col_Word *)&local_50);
              }
              *(undefined8 *)(head + 0x18) = *(undefined8 *)(local_50 + 0x18);
              *(undefined8 *)(local_50 + 0x18) = *(undefined8 *)(local_50 + 0x10);
              *(undefined8 *)(local_50 + 0x10) = *(undefined8 *)(head + 0x10);
              *(byte **)(head + 0x10) = local_50;
              UpdateMConcatNode((Col_Word)local_50);
            }
            *(Col_Word *)(first_local + 0x10) = head;
          }
          UpdateMConcatNode(head);
        }
      }
    }
    else if (last_local == 0) {
      length = length % root;
      head = head & 0xfffffffffffffff7;
      CVar1 = Col_Sublist(head,length + 1,loop - 1);
      right = Col_Sublist(head,0,length);
      CVar1 = NewMConcatList(CVar1,right);
      *(Col_Word *)(first_local + 0x10) = CVar1 | 8;
    }
    else {
      last_local = last_local % root;
      if (last_local == 0) {
        last_local = root;
      }
      length = length % root;
      if (length < last_local) {
        node = Col_Sublist(first_local,0,length);
        head = head & 0xfffffffffffffff7;
        if (last_local < loop) {
          MListRemove(&head,last_local,loop - 1);
        }
        MListRemove(&head,0,length);
        CVar1 = NewMConcatList(node,head | 8);
        *(Col_Word *)(first_local + 0x10) = CVar1;
      }
      else {
        head = head & 0xfffffffffffffff7;
        MListRemove(&head,last_local,length);
        *(Col_Word *)(first_local + 0x10) = head | 8;
      }
    }
  }
  return;
}

Assistant:

void
Col_MListRemove(
    Col_Word mlist, /*!< Mutable list to remove sequence from. */
    size_t first,   /*!< Index of first element in range to remove. */
    size_t last)    /*!< Index of last element in range to remove. */
{
    size_t length, loop;
    Col_Word root;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    if (first > last) {
        /*
         * No-op.
         */

        return;
    }

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    root = WORD_WRAP_SOURCE(mlist);

    length = Col_ListLength(mlist);
    loop = Col_ListLoopLength(mlist);
    if (loop && length == loop) {
        /*
         * List is circular.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CIRCLIST);

        if (first == 0) {
            /*
             * Rotate loop.
             */

            last %= loop;
            root = WORD_CIRCLIST_CORE(root);
            root = NewMConcatList(
                Col_Sublist(root, last+1, length-1),
                Col_Sublist(root, 0, last));
            WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_NEW(root);
        } else {
            /*
             * Remove middle of loop.
             */

            first %= loop;
            if (first == 0) first = loop;
            last %= loop;

            if (last < first) {
                /*
                 * Keep inner part of loop and use beginning as head.
                 */

                Col_Word head, node;

                head = Col_Sublist(mlist, 0, last);
                root = WORD_CIRCLIST_CORE(root);
                if (first < length) {
                    MListRemove(&root, first, length-1);
                }
                MListRemove(&root, 0, last);

                node = NewMConcatList(head, WORD_CIRCLIST_NEW(root));
                WORD_WRAP_SOURCE(mlist) = node;
            } else {
                /*
                 * Remove inner part of loop.
                 */

                root = WORD_CIRCLIST_CORE(root);
                MListRemove(&root, first, last);
                WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_NEW(root);
            }
        }
        return;
    } else if (loop) {
        /*
         * List is cyclic.
         */

        if (WORD_TYPE(root) != WORD_TYPE_MCONCATLIST) {
            ConvertToMConcatNode(&root);
            WORD_WRAP_SOURCE(mlist) = root;
        }
        ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
        ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

        if (first == 0 && last >= length-loop-1) {
            /*
             * Remove whole head and recurse on tail.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            if (last >= length-loop) {
                Col_MListRemove(mlist, 0, last - (length-loop));
            }
            return;
        }

        if (last < length-loop) {
            /*
             * Remove within head.
             */

            MListRemove(&WORD_CONCATLIST_LEFT(root), first, last);
        } else {
            /*
             * Remove part of tail.
             */

            Col_Word tail;

            if (first >= length-loop) {
                first -= length-loop;
                last -= length-loop;
            } else {
                /*
                 * Remove end of head first.
                 */

                MListRemove(&WORD_CONCATLIST_LEFT(root), first, length-loop-1);
                first = 0;
                last -= length-loop;
            }

            /*
             *  Temporarily use tail as root before recursive call.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            Col_MListRemove(mlist, first, last);
            tail = WORD_WRAP_SOURCE(mlist);
            if (WORD_TYPE(tail) != WORD_TYPE_CIRCLIST) {
                /*
                 * Circular list was made cyclic in the process. Move head to
                 * left.
                 */

                if (WORD_TYPE(tail) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&tail);
                }
                ASSERT(WORD_TYPE(tail) == WORD_TYPE_MCONCATLIST);
                WORD_CONCATLIST_RIGHT(root) = WORD_CONCATLIST_RIGHT(tail);
                WORD_CONCATLIST_RIGHT(tail) = WORD_CONCATLIST_LEFT(tail);
                WORD_CONCATLIST_LEFT(tail) = WORD_CONCATLIST_LEFT(root);
                WORD_CONCATLIST_LEFT(root) = tail;
                UpdateMConcatNode(tail);
            } else {
                WORD_CONCATLIST_RIGHT(root) = tail;
            }

            ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
            ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

            /*
             * Restore root.
             */

            WORD_WRAP_SOURCE(mlist) = root;
        }
        UpdateMConcatNode(root);
        return;
    }

    /*
     * Acyclic list.
     */

    if (length == 0 || first >= length) {
        /*
         * No-op.
         */

        return;
    }

    if (last >= length) {
        last = length-1;
    }

    /*
     * General case.
     */

    MListRemove(&WORD_WRAP_SOURCE(mlist), first, last);
}